

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O2

void aom_paeth_predictor_16x32_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  int iVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  __m256i l16;
  __m256i tl16;
  __m256i top;
  __m256i local_c0;
  __m256i local_a0;
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  
  uVar2 = *(undefined8 *)*(undefined1 (*) [16])(left + 0x10);
  uVar3 = *(undefined8 *)(left + 0x18);
  auVar6 = *(undefined1 (*) [16])(left + 0x10);
  bVar1 = above[-1];
  local_a0[0] = (ulong)CONCAT16(bVar1,(uint6)CONCAT14(bVar1,(uint)CONCAT12(bVar1,(ushort)bVar1)));
  local_a0[1]._0_1_ = bVar1;
  local_a0[1]._1_1_ = 0;
  local_a0[1]._2_1_ = bVar1;
  local_a0[1]._3_1_ = 0;
  local_a0[1]._4_1_ = bVar1;
  local_a0[1]._5_1_ = 0;
  local_a0[1]._6_1_ = bVar1;
  local_a0[1]._7_1_ = 0;
  local_a0[2]._0_1_ = bVar1;
  local_a0[2]._1_1_ = 0;
  local_a0[2]._2_1_ = bVar1;
  local_a0[2]._3_1_ = 0;
  local_a0[2]._4_1_ = bVar1;
  local_a0[2]._5_1_ = 0;
  local_a0[2]._6_1_ = bVar1;
  local_a0[2]._7_1_ = 0;
  local_a0[3]._0_1_ = bVar1;
  local_a0[3]._1_1_ = 0;
  local_a0[3]._2_1_ = bVar1;
  local_a0[3]._3_1_ = 0;
  local_a0[3]._4_1_ = bVar1;
  local_a0[3]._5_1_ = 0;
  local_a0[3]._6_1_ = bVar1;
  local_a0[3]._7_1_ = 0;
  local_80 = vpmovzxbw_avx(*(undefined1 (*) [16])above);
  local_70 = vpunpckhbw_avx(*(undefined1 (*) [16])above,(undefined1  [16])0x0);
  auVar11._8_8_ = 0x8000800080008000;
  auVar11._0_8_ = 0x8000800080008000;
  auVar11._16_8_ = 0x8000800080008000;
  auVar11._24_8_ = 0x8000800080008000;
  iVar7 = 0x10;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    auVar4._16_8_ = uVar2;
    auVar4._0_16_ = auVar6;
    auVar4._24_8_ = uVar3;
    local_c0 = (__m256i)vpshufb_avx2(auVar4,auVar11);
    auVar9 = local_c0._0_16_;
    paeth_16x1_pred(&local_c0,(__m256i *)local_80,&local_a0);
    *(undefined1 (*) [16])dst = auVar9;
    dst = *(undefined1 (*) [16])dst + stride;
    auVar11 = vpsubw_avx2(auVar11,_DAT_0046cd40);
  }
  uVar2 = *(undefined8 *)*(undefined1 (*) [16])(left + 0x20);
  uVar3 = *(undefined8 *)(left + 0x28);
  auVar6 = *(undefined1 (*) [16])(left + 0x20);
  auVar10._8_8_ = 0x8000800080008000;
  auVar10._0_8_ = 0x8000800080008000;
  auVar10._16_8_ = 0x8000800080008000;
  auVar10._24_8_ = 0x8000800080008000;
  iVar7 = 0x10;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    auVar5._16_8_ = uVar2;
    auVar5._0_16_ = auVar6;
    auVar5._24_8_ = uVar3;
    local_c0 = (__m256i)vpshufb_avx2(auVar5,auVar10);
    auVar9 = local_c0._0_16_;
    paeth_16x1_pred(&local_c0,(__m256i *)local_80,&local_a0);
    *(undefined1 (*) [16])dst = auVar9;
    dst = *(undefined1 (*) [16])dst + stride;
    auVar10 = vpsubw_avx2(auVar10,_DAT_0046cd40);
  }
  return;
}

Assistant:

void aom_paeth_predictor_16x32_avx2(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  __m256i l = get_left_vector(left);
  const __m256i tl16 = _mm256_set1_epi16((int16_t)above[-1]);
  __m256i rep = _mm256_set1_epi16((short)0x8000);
  const __m256i one = _mm256_set1_epi16(1);
  const __m256i top = get_top_vector(above);

  int i;
  for (i = 0; i < 16; ++i) {
    const __m256i l16 = _mm256_shuffle_epi8(l, rep);
    const __m128i row = paeth_16x1_pred(&l16, &top, &tl16);

    _mm_store_si128((__m128i *)dst, row);
    dst += stride;
    rep = _mm256_add_epi16(rep, one);
  }

  l = get_left_vector(left + 16);
  rep = _mm256_set1_epi16((short)0x8000);
  for (i = 0; i < 16; ++i) {
    const __m256i l16 = _mm256_shuffle_epi8(l, rep);
    const __m128i row = paeth_16x1_pred(&l16, &top, &tl16);

    _mm_store_si128((__m128i *)dst, row);
    dst += stride;
    rep = _mm256_add_epi16(rep, one);
  }
}